

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ReportLeaksOnProcessDetach(Recycler *this)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  AutoLeakReportSection local_18;
  AutoLeakReportSection __autoLeakReportSection2;
  Recycler *this_local;
  
  __autoLeakReportSection2.m_flags = (ConfigFlagsTable *)this;
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::ConfigFlagsTable::IsEnabled(pCVar2,LeakReportFlag);
  if (bVar1) {
    pCVar2 = GetRecyclerFlagsTable(this);
    AutoLeakReportSection::AutoLeakReportSection
              (&local_18,pCVar2,L"Recycler (%p): Process Termination",this);
    LeakReport::StartRedirectOutput();
    ReportOnProcessDetach<Memory::Recycler::ReportLeaksOnProcessDetach()::__0>
              (this,(anon_class_8_1_8991fb9c)this);
    LeakReport::EndRedirectOutput();
    AutoLeakReportSection::~AutoLeakReportSection(&local_18);
  }
  return;
}

Assistant:

void
Recycler::ReportLeaksOnProcessDetach()
{
    if (GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag))
    {
        AUTO_LEAK_REPORT_SECTION(this->GetRecyclerFlagsTable(), _u("Recycler (%p): Process Termination"), this);
        LeakReport::StartRedirectOutput();
        ReportOnProcessDetach([=]() { this->ReportLeaks(); });
        LeakReport::EndRedirectOutput();
    }
}